

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.cc
# Opt level: O0

void load_GL_NV_draw_vulkan_image(GLADloadproc load)

{
  code *in_RDI;
  
  if (GLAD_GL_NV_draw_vulkan_image != 0) {
    glad_glDrawVkImageNV = (PFNGLDRAWVKIMAGENVPROC)(*in_RDI)("glDrawVkImageNV");
    glad_glGetVkProcAddrNV = (PFNGLGETVKPROCADDRNVPROC)(*in_RDI)("glGetVkProcAddrNV");
    glad_glWaitVkSemaphoreNV = (PFNGLWAITVKSEMAPHORENVPROC)(*in_RDI)("glWaitVkSemaphoreNV");
    glad_glSignalVkSemaphoreNV = (PFNGLSIGNALVKSEMAPHORENVPROC)(*in_RDI)("glSignalVkSemaphoreNV");
    glad_glSignalVkFenceNV = (PFNGLSIGNALVKFENCENVPROC)(*in_RDI)("glSignalVkFenceNV");
  }
  return;
}

Assistant:

static void load_GL_NV_draw_vulkan_image(GLADloadproc load) {
	if(!GLAD_GL_NV_draw_vulkan_image) return;
	glad_glDrawVkImageNV = (PFNGLDRAWVKIMAGENVPROC)load("glDrawVkImageNV");
	glad_glGetVkProcAddrNV = (PFNGLGETVKPROCADDRNVPROC)load("glGetVkProcAddrNV");
	glad_glWaitVkSemaphoreNV = (PFNGLWAITVKSEMAPHORENVPROC)load("glWaitVkSemaphoreNV");
	glad_glSignalVkSemaphoreNV = (PFNGLSIGNALVKSEMAPHORENVPROC)load("glSignalVkSemaphoreNV");
	glad_glSignalVkFenceNV = (PFNGLSIGNALVKFENCENVPROC)load("glSignalVkFenceNV");
}